

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O2

void __thiscall
QArrayDataPointer<VcsolutionDepend_*>::relocate
          (QArrayDataPointer<VcsolutionDepend_*> *this,qsizetype offset,VcsolutionDepend ***data)

{
  VcsolutionDepend **d_first;
  VcsolutionDepend **ppVVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<VcsolutionDepend*,long_long>(this->ptr,this->size,d_first);
  if (data != (VcsolutionDepend ***)0x0) {
    ppVVar1 = *data;
    if ((this->ptr <= ppVVar1) && (ppVVar1 < this->ptr + this->size)) {
      *data = ppVVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }